

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O2

void jsons_print_object(lyout *out,char *label,char *arg,char *val,int closeit,int *first)

{
  char *pcVar1;
  char *pcVar2;
  
  if (val != (char *)0x0) {
    if (first == (int *)0x0) {
      pcVar1 = "}";
      if (closeit == 0) {
        pcVar1 = "";
      }
      ly_print(out,"%s\"%s\":{\"%s\":\"%s\"%s",",",label,arg,val,pcVar1);
    }
    else {
      pcVar1 = ",";
      if (*first != 0) {
        pcVar1 = "";
      }
      pcVar2 = "}";
      if (closeit == 0) {
        pcVar2 = "";
      }
      ly_print(out,"%s\"%s\":{\"%s\":\"%s\"%s",pcVar1,label,arg,val,pcVar2);
      *first = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_object(struct lyout *out, const char *label, const char *arg, const char *val, int closeit, int *first)
{
    if (!val) {
        return;
    }

    ly_print(out, "%s\"%s\":{\"%s\":\"%s\"%s", (first && (*first)) ? "" : ",", label, arg, val, closeit ? "}" : "");

    if (first) {
        (*first) = 0;
    }
}